

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

int __thiscall PClass::FindVirtualIndex(PClass *this,FName *name,PPrototype *proto)

{
  uint uVar1;
  uint uVar2;
  VMFunction *pVVar3;
  PPrototype *pPVar4;
  bool bVar5;
  int in_EAX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar6 = (ulong)(this->Virtuals).Count;
  if (uVar6 == 0) {
    return -1;
  }
  uVar7 = 0;
  do {
    pVVar3 = (this->Virtuals).Array[uVar7];
    if ((pVVar3->Name).Index == name->Index) {
      pPVar4 = pVVar3->Proto;
      uVar1 = (proto->ReturnTypes).Count;
      bVar5 = false;
      if (((pPVar4->ReturnTypes).Count == uVar1) &&
         (uVar2 = (proto->ArgumentTypes).Count, (pPVar4->ArgumentTypes).Count == uVar2)) {
        bVar9 = 1 < uVar2;
        if (bVar9) {
          lVar8 = 1;
          do {
            if ((proto->ArgumentTypes).Array[lVar8] != (pPVar4->ArgumentTypes).Array[lVar8])
            goto LAB_0037ddfa;
            lVar8 = lVar8 + 1;
          } while (uVar2 != (uint)lVar8);
          bVar9 = false;
        }
        if (uVar1 != 0) {
          lVar8 = 0;
          do {
            if ((proto->ReturnTypes).Array[lVar8] != (pPVar4->ReturnTypes).Array[lVar8]) {
              bVar9 = true;
              break;
            }
            lVar8 = lVar8 + 1;
          } while (uVar1 != (uint)lVar8);
        }
        bVar5 = (bool)(bVar9 ^ 1);
        if (!bVar9) {
          in_EAX = (int)uVar7;
        }
      }
LAB_0037ddfa:
      if (bVar5) {
        return in_EAX;
      }
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == uVar6) {
      return -1;
    }
  } while( true );
}

Assistant:

int PClass::FindVirtualIndex(FName name, PPrototype *proto)
{
	for (unsigned i = 0; i < Virtuals.Size(); i++)
	{
		if (Virtuals[i]->Name == name)
		{
			auto vproto = Virtuals[i]->Proto;
			if (vproto->ReturnTypes.Size() != proto->ReturnTypes.Size() ||
				vproto->ArgumentTypes.Size() != proto->ArgumentTypes.Size())
			{
				continue;	// number of parameters does not match, so it's incompatible
			}
			bool fail = false;
			// The first argument is self and will mismatch so just skip it.
			for (unsigned a = 1; a < proto->ArgumentTypes.Size(); a++)
			{
				if (proto->ArgumentTypes[a] != vproto->ArgumentTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (fail) continue;

			for (unsigned a = 0; a < proto->ReturnTypes.Size(); a++)
			{
				if (proto->ReturnTypes[a] != vproto->ReturnTypes[a])
				{
					fail = true;
					break;
				}
			}
			if (!fail) return i;
		}
	}
	return -1;
}